

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::snapshot_sync_req::serialize(snapshot_sync_req *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<buffer> pVar4;
  ptr<buffer> snp_buf;
  buffer *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  snapshot::serialize((snapshot *)&local_30);
  sVar1 = buffer::size(local_30);
  sVar2 = buffer::size(*(buffer **)(in_RSI + 0x18));
  sVar3 = buffer::pos(*(buffer **)(in_RSI + 0x18));
  buffer::alloc((buffer *)this,((sVar1 + sVar2) - sVar3) + 9);
  buffer::put((buffer *)
              (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,local_30);
  buffer::put((buffer *)
              (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,*(ulong *)(in_RSI + 0x10));
  buffer::put((buffer *)
              (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,*(byte *)(in_RSI + 0x28));
  buffer::put((buffer *)
              (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,*(buffer **)(in_RSI + 0x18));
  buffer::pos((buffer *)
              (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  pVar4.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar4.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar4.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> snapshot_sync_req::serialize() {
    ptr<buffer> snp_buf = snapshot_->serialize();
    ptr<buffer> buf = buffer::alloc(snp_buf->size() + sz_ulong + sz_byte + (data_->size() - data_->pos()));
    buf->put(*snp_buf);
    buf->put(offset_);
    buf->put(done_ ? (byte)1 : (byte)0);
    buf->put(*data_);
    buf->pos(0);
    return buf;
}